

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O2

int aom_compute_pyramid(YV12_BUFFER_CONFIG *frame,int bit_depth,int n_levels,ImagePyramid *pyr)

{
  uint width;
  uint height;
  int iVar1;
  int height2;
  int out_stride;
  PyramidLayer *pPVar2;
  uint8_t *puVar3;
  int height_00;
  int width_00;
  _Bool _Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  int x;
  ulong uVar12;
  
  pthread_mutex_lock((pthread_mutex_t *)pyr);
  iVar5 = pyr->filled_levels;
  if (pyr->max_levels < n_levels) {
    n_levels = pyr->max_levels;
  }
  if (iVar5 < n_levels) {
    if (iVar5 == 0) {
      width = (frame->field_2).field_0.y_crop_width;
      height = (frame->field_3).field_0.y_crop_height;
      iVar5 = (frame->field_4).field_0.y_stride;
      pPVar2 = pyr->layers;
      puVar3 = (frame->field_5).field_0.y_buffer;
      if ((frame->flags & 8) == 0) {
        pPVar2->buffer = puVar3;
        pPVar2->width = width;
        pPVar2->height = height;
        pPVar2->stride = iVar5;
      }
      else {
        lVar6 = (long)puVar3 * 2;
        puVar3 = pPVar2->buffer;
        iVar1 = pPVar2->stride;
        uVar9 = 0;
        uVar10 = 0;
        if (0 < (int)width) {
          uVar10 = (ulong)width;
        }
        uVar7 = 0;
        if (0 < (int)height) {
          uVar7 = (ulong)height;
        }
        puVar11 = puVar3;
        for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            puVar11[uVar12] =
                 (uint8_t)(*(ushort *)(lVar6 + uVar12 * 2) >> ((char)bit_depth - 8U & 0x1f));
          }
          puVar11 = puVar11 + iVar1;
          lVar6 = lVar6 + (long)iVar5 * 2;
        }
        fill_border(puVar3,width,height,iVar1);
      }
      iVar5 = 1;
    }
    lVar6 = (long)iVar5;
    lVar8 = lVar6 * 0x18 + 0x10;
    for (; iVar5 = n_levels, lVar6 < n_levels; lVar6 = lVar6 + 1) {
      pPVar2 = pyr->layers;
      puVar3 = *(uint8_t **)((long)pPVar2 + lVar8 + -0x28);
      iVar5 = *(int *)((long)&pPVar2[-1].buffer + lVar8);
      puVar11 = *(uint8_t **)((long)pPVar2 + lVar8 + -0x10);
      iVar1 = *(int *)((long)pPVar2 + lVar8 + -8);
      height2 = *(int *)((long)pPVar2 + lVar8 + -4);
      out_stride = *(int *)((long)&pPVar2->buffer + lVar8);
      width_00 = iVar1 * 2;
      height_00 = height2 * 2;
      _Var4 = should_resize_by_half(height_00,width_00,height2,iVar1);
      if (_Var4) {
        _Var4 = av1_resize_plane_to_half
                          (puVar3,height_00,width_00,iVar5,puVar11,height2,iVar1,out_stride);
      }
      else {
        _Var4 = av1_resize_plane(puVar3,height_00,width_00,iVar5,puVar11,height2,iVar1,out_stride);
      }
      if (_Var4 == false) {
        iVar5 = -1;
        break;
      }
      fill_border(puVar11,iVar1,height2,out_stride);
      lVar8 = lVar8 + 0x18;
    }
    pyr->filled_levels = n_levels;
    n_levels = iVar5;
  }
  pthread_mutex_unlock((pthread_mutex_t *)pyr);
  return n_levels;
}

Assistant:

int aom_compute_pyramid(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                        int n_levels, ImagePyramid *pyr) {
  assert(pyr);

  // Per the comments in the ImagePyramid struct, we must take this mutex
  // before reading or writing the filled_levels field, and hold it while
  // computing any additional pyramid levels, to ensure proper behaviour
  // when multithreading is used
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD

  n_levels = AOMMIN(n_levels, pyr->max_levels);
  int result = n_levels;
  if (pyr->filled_levels < n_levels) {
    // Compute any missing levels that we need
    result = fill_pyramid(frame, bit_depth, n_levels, pyr);
  }

  // At this point, as long as result >= 0, the requested number of pyramid
  // levels are guaranteed to be valid, and can be safely read from without
  // holding the mutex any further
  assert(IMPLIES(result >= 0, pyr->filled_levels >= n_levels));
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
  return result;
}